

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined4 uVar58;
  undefined1 auVar59 [32];
  undefined4 uVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 (*pauVar74) [16];
  uint uVar75;
  undefined1 (*pauVar76) [16];
  long lVar77;
  byte bVar78;
  uint uVar79;
  int iVar80;
  ulong uVar81;
  Scene *pSVar82;
  ulong uVar83;
  ulong uVar84;
  uint uVar85;
  long lVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  float fVar90;
  float fVar101;
  float fVar102;
  vint4 bi_1;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar91 [16];
  float fVar103;
  undefined1 auVar96 [32];
  undefined1 auVar92 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar100 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  vint4 bi;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  vint4 ai;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [32];
  undefined1 auVar122 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar131;
  undefined1 auVar130 [64];
  float fVar132;
  float fVar138;
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  float fVar136;
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar135 [64];
  float fVar142;
  float fVar144;
  float fVar145;
  uint uVar146;
  float fVar147;
  uint uVar148;
  float fVar149;
  uint uVar150;
  float fVar151;
  uint uVar152;
  float fVar153;
  uint uVar154;
  uint uVar155;
  undefined1 auVar143 [64];
  float fVar156;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar157 [32];
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar165 [32];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  Scene *scene;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [16];
  undefined1 local_1490 [16];
  RTCFilterFunctionNArguments local_1470;
  undefined1 local_1440 [8];
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  undefined4 uStack_1424;
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  Scene *local_13e0;
  undefined1 auStack_13d8 [24];
  undefined1 local_13b0 [16];
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float local_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar76 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1350._4_4_ = uVar1;
  local_1350._0_4_ = uVar1;
  local_1350._8_4_ = uVar1;
  local_1350._12_4_ = uVar1;
  auVar130 = ZEXT1664(local_1350);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1360._4_4_ = uVar1;
  local_1360._0_4_ = uVar1;
  local_1360._8_4_ = uVar1;
  local_1360._12_4_ = uVar1;
  auVar135 = ZEXT1664(local_1360);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1370._4_4_ = uVar1;
  local_1370._0_4_ = uVar1;
  local_1370._8_4_ = uVar1;
  local_1370._12_4_ = uVar1;
  auVar143 = ZEXT1664(local_1370);
  fStack_1374 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_1384 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_1394 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar83 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar89 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar88 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar80 = (tray->tfar).field_0.i[k];
  auVar100 = ZEXT1664(CONCAT412(iVar80,CONCAT48(iVar80,CONCAT44(iVar80,iVar80))));
  iVar80 = (tray->tnear).field_0.i[k];
  local_13b0._4_4_ = iVar80;
  local_13b0._0_4_ = iVar80;
  local_13b0._8_4_ = iVar80;
  local_13b0._12_4_ = iVar80;
  auVar177 = ZEXT1664(local_13b0);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  uVar79 = 1 << ((byte)k & 0x1f);
  auVar123._8_4_ = 0x3f800000;
  auVar123._0_8_ = 0x3f8000003f800000;
  auVar123._12_4_ = 0x3f800000;
  auVar123._16_4_ = 0x3f800000;
  auVar123._20_4_ = 0x3f800000;
  auVar123._24_4_ = 0x3f800000;
  auVar123._28_4_ = 0x3f800000;
  auVar108._8_4_ = 0xbf800000;
  auVar108._0_8_ = 0xbf800000bf800000;
  auVar108._12_4_ = 0xbf800000;
  auVar108._16_4_ = 0xbf800000;
  auVar108._20_4_ = 0xbf800000;
  auVar108._24_4_ = 0xbf800000;
  auVar108._28_4_ = 0xbf800000;
  _local_1120 = vblendvps_avx(auVar123,auVar108,local_1100);
  fStack_1378 = fStack_1374;
  fStack_137c = fStack_1374;
  local_1380 = fStack_1374;
  fStack_1388 = fStack_1384;
  fStack_138c = fStack_1384;
  local_1390 = fStack_1384;
  fStack_1398 = fStack_1394;
  fStack_139c = fStack_1394;
  local_13a0 = fStack_1394;
  fVar175 = fStack_1394;
  fVar174 = fStack_1394;
  fVar173 = fStack_1394;
  fVar172 = fStack_1394;
  fVar131 = fStack_1384;
  fVar106 = fStack_1384;
  fVar105 = fStack_1384;
  fVar104 = fStack_1384;
  fVar103 = fStack_1374;
  fVar102 = fStack_1374;
  fVar101 = fStack_1374;
  fVar90 = fStack_1374;
  local_1470.ray = (RTCRayN *)ray;
LAB_0039b55a:
  do {
    pauVar74 = pauVar76 + -1;
    pauVar76 = pauVar76 + -1;
    if (*(float *)(*pauVar74 + 8) <= *(float *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x100)) {
      uVar81 = *(ulong *)*pauVar76;
      while ((uVar81 & 8) == 0) {
        auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar81 + 0x20 + uVar83),auVar130._0_16_);
        auVar107._0_4_ = fVar90 * auVar92._0_4_;
        auVar107._4_4_ = fVar101 * auVar92._4_4_;
        auVar107._8_4_ = fVar102 * auVar92._8_4_;
        auVar107._12_4_ = fVar103 * auVar92._12_4_;
        auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar81 + 0x20 + uVar89),auVar135._0_16_);
        auVar91._0_4_ = fVar104 * auVar92._0_4_;
        auVar91._4_4_ = fVar105 * auVar92._4_4_;
        auVar91._8_4_ = fVar106 * auVar92._8_4_;
        auVar91._12_4_ = fVar131 * auVar92._12_4_;
        auVar92 = vpmaxsd_avx(auVar107,auVar91);
        auVar107 = vsubps_avx(*(undefined1 (*) [16])(uVar81 + 0x20 + uVar88),auVar143._0_16_);
        auVar133._0_4_ = fVar172 * auVar107._0_4_;
        auVar133._4_4_ = fVar173 * auVar107._4_4_;
        auVar133._8_4_ = fVar174 * auVar107._8_4_;
        auVar133._12_4_ = fVar175 * auVar107._12_4_;
        auVar107 = vpmaxsd_avx(auVar133,auVar177._0_16_);
        auVar107 = vpmaxsd_avx(auVar92,auVar107);
        auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar81 + 0x20 + (uVar83 ^ 0x10)),auVar130._0_16_
                            );
        auVar114._0_4_ = fVar90 * auVar92._0_4_;
        auVar114._4_4_ = fVar101 * auVar92._4_4_;
        auVar114._8_4_ = fVar102 * auVar92._8_4_;
        auVar114._12_4_ = fVar103 * auVar92._12_4_;
        auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar81 + 0x20 + (uVar89 ^ 0x10)),auVar135._0_16_
                            );
        auVar120._0_4_ = fVar104 * auVar92._0_4_;
        auVar120._4_4_ = fVar105 * auVar92._4_4_;
        auVar120._8_4_ = fVar106 * auVar92._8_4_;
        auVar120._12_4_ = fVar131 * auVar92._12_4_;
        auVar92 = vpminsd_avx(auVar114,auVar120);
        auVar91 = vsubps_avx(*(undefined1 (*) [16])(uVar81 + 0x20 + (uVar88 ^ 0x10)),auVar143._0_16_
                            );
        auVar121._0_4_ = fVar172 * auVar91._0_4_;
        auVar121._4_4_ = fVar173 * auVar91._4_4_;
        auVar121._8_4_ = fVar174 * auVar91._8_4_;
        auVar121._12_4_ = fVar175 * auVar91._12_4_;
        auVar91 = vpminsd_avx(auVar121,auVar100._0_16_);
        auVar92 = vpminsd_avx(auVar92,auVar91);
        auVar92 = vpcmpgtd_avx(auVar107,auVar92);
        iVar80 = vmovmskps_avx(auVar92);
        local_1320._0_16_ = auVar107;
        if (iVar80 == 0xf) {
          if (pauVar76 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_0039b55a;
        }
        bVar78 = (byte)iVar80 ^ 0xf;
        uVar87 = uVar81 & 0xfffffffffffffff0;
        lVar86 = 0;
        if (bVar78 != 0) {
          for (; (bVar78 >> lVar86 & 1) == 0; lVar86 = lVar86 + 1) {
          }
        }
        uVar81 = *(ulong *)(uVar87 + lVar86 * 8);
        uVar85 = bVar78 - 1 & (uint)bVar78;
        if (uVar85 != 0) {
          uVar75 = *(uint *)(local_1320 + lVar86 * 4);
          lVar86 = 0;
          if (uVar85 != 0) {
            for (; (uVar85 >> lVar86 & 1) == 0; lVar86 = lVar86 + 1) {
            }
          }
          uVar84 = *(ulong *)(uVar87 + lVar86 * 8);
          uVar146 = *(uint *)(local_1320 + lVar86 * 4);
          uVar85 = uVar85 - 1 & uVar85;
          if (uVar85 == 0) {
            if (uVar75 < uVar146) {
              *(ulong *)*pauVar76 = uVar84;
              *(uint *)(*pauVar76 + 8) = uVar146;
              pauVar76 = pauVar76 + 1;
            }
            else {
              *(ulong *)*pauVar76 = uVar81;
              *(uint *)(*pauVar76 + 8) = uVar75;
              pauVar76 = pauVar76 + 1;
              uVar81 = uVar84;
            }
          }
          else {
            auVar92._8_8_ = 0;
            auVar92._0_8_ = uVar81;
            auVar92 = vpunpcklqdq_avx(auVar92,ZEXT416(uVar75));
            auVar115._8_8_ = 0;
            auVar115._0_8_ = uVar84;
            auVar107 = vpunpcklqdq_avx(auVar115,ZEXT416(uVar146));
            lVar86 = 0;
            if (uVar85 != 0) {
              for (; (uVar85 >> lVar86 & 1) == 0; lVar86 = lVar86 + 1) {
              }
            }
            auVar122._8_8_ = 0;
            auVar122._0_8_ = *(ulong *)(uVar87 + lVar86 * 8);
            auVar133 = vpunpcklqdq_avx(auVar122,ZEXT416(*(uint *)(local_1320 + lVar86 * 4)));
            auVar91 = vpcmpgtd_avx(auVar107,auVar92);
            uVar85 = uVar85 - 1 & uVar85;
            if (uVar85 == 0) {
              auVar114 = vpshufd_avx(auVar91,0xaa);
              auVar91 = vblendvps_avx(auVar107,auVar92,auVar114);
              auVar92 = vblendvps_avx(auVar92,auVar107,auVar114);
              auVar107 = vpcmpgtd_avx(auVar133,auVar91);
              auVar114 = vpshufd_avx(auVar107,0xaa);
              auVar107 = vblendvps_avx(auVar133,auVar91,auVar114);
              auVar91 = vblendvps_avx(auVar91,auVar133,auVar114);
              auVar133 = vpcmpgtd_avx(auVar91,auVar92);
              auVar114 = vpshufd_avx(auVar133,0xaa);
              auVar133 = vblendvps_avx(auVar91,auVar92,auVar114);
              auVar92 = vblendvps_avx(auVar92,auVar91,auVar114);
              *pauVar76 = auVar92;
              pauVar76[1] = auVar133;
              uVar81 = auVar107._0_8_;
              pauVar76 = pauVar76 + 2;
            }
            else {
              lVar86 = 0;
              if (uVar85 != 0) {
                for (; (uVar85 >> lVar86 & 1) == 0; lVar86 = lVar86 + 1) {
                }
              }
              auVar125._8_8_ = 0;
              auVar125._0_8_ = *(ulong *)(uVar87 + lVar86 * 8);
              auVar120 = vpunpcklqdq_avx(auVar125,ZEXT416(*(uint *)(local_1320 + lVar86 * 4)));
              auVar114 = vpshufd_avx(auVar91,0xaa);
              auVar91 = vblendvps_avx(auVar107,auVar92,auVar114);
              auVar92 = vblendvps_avx(auVar92,auVar107,auVar114);
              auVar107 = vpcmpgtd_avx(auVar120,auVar133);
              auVar114 = vpshufd_avx(auVar107,0xaa);
              auVar107 = vblendvps_avx(auVar120,auVar133,auVar114);
              auVar133 = vblendvps_avx(auVar133,auVar120,auVar114);
              auVar114 = vpcmpgtd_avx(auVar133,auVar92);
              auVar120 = vpshufd_avx(auVar114,0xaa);
              auVar114 = vblendvps_avx(auVar133,auVar92,auVar120);
              auVar92 = vblendvps_avx(auVar92,auVar133,auVar120);
              auVar133 = vpcmpgtd_avx(auVar107,auVar91);
              auVar120 = vpshufd_avx(auVar133,0xaa);
              auVar133 = vblendvps_avx(auVar107,auVar91,auVar120);
              auVar107 = vblendvps_avx(auVar91,auVar107,auVar120);
              auVar91 = vpcmpgtd_avx(auVar114,auVar107);
              auVar120 = vpshufd_avx(auVar91,0xaa);
              auVar91 = vblendvps_avx(auVar114,auVar107,auVar120);
              auVar107 = vblendvps_avx(auVar107,auVar114,auVar120);
              *pauVar76 = auVar92;
              pauVar76[1] = auVar107;
              pauVar76[2] = auVar91;
              uVar81 = auVar133._0_8_;
              pauVar76 = pauVar76 + 3;
            }
          }
        }
      }
      uVar87 = (ulong)((uint)uVar81 & 0xf);
      if (uVar87 != 8) {
        uVar81 = uVar81 & 0xfffffffffffffff0;
        lVar86 = 0;
        do {
          lVar77 = lVar86 * 0x60;
          pSVar82 = context->scene;
          ppfVar4 = (pSVar82->vertices).items;
          pfVar5 = ppfVar4[*(uint *)(uVar81 + 0x40 + lVar77)];
          pfVar6 = ppfVar4[*(uint *)(uVar81 + 0x44 + lVar77)];
          pfVar7 = ppfVar4[*(uint *)(uVar81 + 0x48 + lVar77)];
          pfVar8 = ppfVar4[*(uint *)(uVar81 + 0x4c + lVar77)];
          auVar91 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar81 + lVar77)),
                                  *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar81 + 8 + lVar77)));
          auVar92 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar81 + lVar77)),
                                  *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar81 + 8 + lVar77)));
          auVar133 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + 4 + lVar77)),
                                   *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar81 + 0xc + lVar77))
                                  );
          auVar107 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + 4 + lVar77)),
                                   *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar81 + 0xc + lVar77))
                                  );
          auVar120 = vunpcklps_avx(auVar92,auVar107);
          auVar121 = vunpcklps_avx(auVar91,auVar133);
          auVar107 = vunpckhps_avx(auVar91,auVar133);
          auVar133 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar81 + 0x10 + lVar77)),
                                   *(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar81 + 0x18 + lVar77)));
          auVar92 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar81 + 0x10 + lVar77))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar81 + 0x18 + lVar77)));
          auVar114 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar81 + 0x14 + lVar77)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar81 + 0x1c + lVar77)));
          auVar91 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + 0x14 + lVar77))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar81 + 0x1c + lVar77)));
          auVar115 = vunpcklps_avx(auVar92,auVar91);
          auVar122 = vunpcklps_avx(auVar133,auVar114);
          auVar91 = vunpckhps_avx(auVar133,auVar114);
          auVar114 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar81 + 0x20 + lVar77)),
                                   *(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar81 + 0x28 + lVar77)));
          auVar92 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar81 + 0x20 + lVar77))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar81 + 0x28 + lVar77)));
          auVar125 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar81 + 0x24 + lVar77)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar81 + 0x2c + lVar77)));
          auVar133 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar81 + 0x24 + lVar77)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar81 + 0x2c + lVar77)));
          auVar53 = vunpcklps_avx(auVar92,auVar133);
          auVar54 = vunpcklps_avx(auVar114,auVar125);
          auVar133 = vunpckhps_avx(auVar114,auVar125);
          auVar125 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar81 + 0x30 + lVar77)),
                                   *(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar81 + 0x38 + lVar77)));
          auVar92 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar81 + 0x30 + lVar77))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar81 + 0x38 + lVar77)));
          auVar55 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + 0x34 + lVar77))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar81 + 0x3c + lVar77)));
          auVar114 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar81 + 0x34 + lVar77)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar81 + 0x3c + lVar77)));
          auVar56 = vunpcklps_avx(auVar92,auVar114);
          auVar57 = vunpcklps_avx(auVar125,auVar55);
          auVar92 = *(undefined1 (*) [16])(uVar81 + 0x40 + lVar77);
          local_10e0._16_16_ = auVar92;
          local_10e0._0_16_ = auVar92;
          auVar114 = vunpckhps_avx(auVar125,auVar55);
          lVar77 = uVar81 + 0x50 + lVar77;
          local_1340 = *(undefined8 *)(lVar77 + 0x10);
          uStack_1338 = *(undefined8 *)(lVar77 + 0x18);
          uStack_1330 = local_1340;
          uStack_1328 = uStack_1338;
          auVar126._16_16_ = auVar54;
          auVar126._0_16_ = auVar121;
          auVar127._16_16_ = auVar133;
          auVar127._0_16_ = auVar107;
          auVar134._16_16_ = auVar53;
          auVar134._0_16_ = auVar120;
          auVar109._16_16_ = auVar122;
          auVar109._0_16_ = auVar122;
          auVar128._16_16_ = auVar91;
          auVar128._0_16_ = auVar91;
          auVar116._16_16_ = auVar115;
          auVar116._0_16_ = auVar115;
          auVar157._16_16_ = auVar57;
          auVar157._0_16_ = auVar57;
          auVar165._16_16_ = auVar114;
          auVar165._0_16_ = auVar114;
          auVar93._16_16_ = auVar56;
          auVar93._0_16_ = auVar56;
          auVar109 = vsubps_avx(auVar126,auVar109);
          auVar108 = vsubps_avx(auVar127,auVar128);
          auVar123 = vsubps_avx(auVar134,auVar116);
          auVar95 = vsubps_avx(auVar157,auVar126);
          auVar116 = vsubps_avx(auVar165,auVar127);
          auVar93 = vsubps_avx(auVar93,auVar134);
          fVar103 = auVar108._0_4_;
          fVar164 = auVar93._0_4_;
          fVar174 = auVar108._4_4_;
          fVar166 = auVar93._4_4_;
          auVar51._4_4_ = fVar166 * fVar174;
          auVar51._0_4_ = fVar164 * fVar103;
          fVar16 = auVar108._8_4_;
          fVar167 = auVar93._8_4_;
          auVar51._8_4_ = fVar167 * fVar16;
          fVar23 = auVar108._12_4_;
          fVar168 = auVar93._12_4_;
          auVar51._12_4_ = fVar168 * fVar23;
          fVar30 = auVar108._16_4_;
          fVar169 = auVar93._16_4_;
          auVar51._16_4_ = fVar169 * fVar30;
          fVar37 = auVar108._20_4_;
          fVar170 = auVar93._20_4_;
          auVar51._20_4_ = fVar170 * fVar37;
          fVar44 = auVar108._24_4_;
          fVar171 = auVar93._24_4_;
          auVar51._24_4_ = fVar171 * fVar44;
          auVar51._28_4_ = auVar56._12_4_;
          fVar104 = auVar123._0_4_;
          fVar156 = auVar116._0_4_;
          fVar175 = auVar123._4_4_;
          fVar158 = auVar116._4_4_;
          auVar52._4_4_ = fVar158 * fVar175;
          auVar52._0_4_ = fVar156 * fVar104;
          fVar17 = auVar123._8_4_;
          fVar159 = auVar116._8_4_;
          auVar52._8_4_ = fVar159 * fVar17;
          fVar24 = auVar123._12_4_;
          fVar160 = auVar116._12_4_;
          auVar52._12_4_ = fVar160 * fVar24;
          fVar31 = auVar123._16_4_;
          fVar161 = auVar116._16_4_;
          auVar52._16_4_ = fVar161 * fVar31;
          fVar38 = auVar123._20_4_;
          fVar162 = auVar116._20_4_;
          auVar52._20_4_ = fVar162 * fVar38;
          fVar45 = auVar123._24_4_;
          uVar58 = auVar122._12_4_;
          fVar163 = auVar116._24_4_;
          auVar52._24_4_ = fVar163 * fVar45;
          auVar52._28_4_ = uVar58;
          local_1420 = vsubps_avx(auVar52,auVar51);
          fVar142 = auVar95._0_4_;
          fVar144 = auVar95._4_4_;
          auVar59._4_4_ = fVar144 * fVar175;
          auVar59._0_4_ = fVar142 * fVar104;
          fVar145 = auVar95._8_4_;
          auVar59._8_4_ = fVar145 * fVar17;
          fVar147 = auVar95._12_4_;
          auVar59._12_4_ = fVar147 * fVar24;
          fVar149 = auVar95._16_4_;
          auVar59._16_4_ = fVar149 * fVar31;
          fVar151 = auVar95._20_4_;
          auVar59._20_4_ = fVar151 * fVar38;
          fVar153 = auVar95._24_4_;
          auVar59._24_4_ = fVar153 * fVar45;
          auVar59._28_4_ = uVar58;
          fVar105 = auVar109._0_4_;
          fVar11 = auVar109._4_4_;
          auVar61._4_4_ = fVar166 * fVar11;
          auVar61._0_4_ = fVar164 * fVar105;
          fVar18 = auVar109._8_4_;
          auVar61._8_4_ = fVar167 * fVar18;
          fVar25 = auVar109._12_4_;
          auVar61._12_4_ = fVar168 * fVar25;
          fVar32 = auVar109._16_4_;
          auVar61._16_4_ = fVar169 * fVar32;
          fVar39 = auVar109._20_4_;
          auVar61._20_4_ = fVar170 * fVar39;
          fVar46 = auVar109._24_4_;
          uVar60 = auVar115._12_4_;
          auVar61._24_4_ = fVar171 * fVar46;
          auVar61._28_4_ = uVar60;
          _local_1440 = vsubps_avx(auVar61,auVar59);
          auVar62._4_4_ = fVar158 * fVar11;
          auVar62._0_4_ = fVar156 * fVar105;
          auVar62._8_4_ = fVar159 * fVar18;
          auVar62._12_4_ = fVar160 * fVar25;
          auVar62._16_4_ = fVar161 * fVar32;
          auVar62._20_4_ = fVar162 * fVar39;
          auVar62._24_4_ = fVar163 * fVar46;
          auVar62._28_4_ = uVar60;
          auVar63._4_4_ = fVar144 * fVar174;
          auVar63._0_4_ = fVar142 * fVar103;
          auVar63._8_4_ = fVar145 * fVar16;
          auVar63._12_4_ = fVar147 * fVar23;
          auVar63._16_4_ = fVar149 * fVar30;
          auVar63._20_4_ = fVar151 * fVar37;
          auVar63._24_4_ = fVar153 * fVar44;
          auVar63._28_4_ = auVar92._12_4_;
          uVar1 = *(undefined4 *)((RayHitK<8> *)local_1470.ray + k * 4);
          auVar176._4_4_ = uVar1;
          auVar176._0_4_ = uVar1;
          auVar176._8_4_ = uVar1;
          auVar176._12_4_ = uVar1;
          auVar176._16_4_ = uVar1;
          auVar176._20_4_ = uVar1;
          auVar176._24_4_ = uVar1;
          auVar176._28_4_ = uVar1;
          uVar2 = *(undefined4 *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x20);
          auVar178._4_4_ = uVar2;
          auVar178._0_4_ = uVar2;
          auVar178._8_4_ = uVar2;
          auVar178._12_4_ = uVar2;
          auVar178._16_4_ = uVar2;
          auVar178._20_4_ = uVar2;
          auVar178._24_4_ = uVar2;
          auVar178._28_4_ = uVar2;
          uVar3 = *(undefined4 *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x40);
          auVar179._4_4_ = uVar3;
          auVar179._0_4_ = uVar3;
          auVar179._8_4_ = uVar3;
          auVar179._12_4_ = uVar3;
          auVar179._16_4_ = uVar3;
          auVar179._20_4_ = uVar3;
          auVar179._24_4_ = uVar3;
          auVar179._28_4_ = uVar3;
          fVar90 = *(float *)((RayHitK<8> *)local_1470.ray + k * 4 + 0xa0);
          local_1260 = vsubps_avx(auVar63,auVar62);
          auVar108 = vsubps_avx(auVar126,auVar176);
          fVar101 = *(float *)((RayHitK<8> *)local_1470.ray + k * 4 + 0xc0);
          auVar123 = vsubps_avx(auVar127,auVar178);
          auVar51 = vsubps_avx(auVar134,auVar179);
          fVar132 = auVar51._0_4_;
          fVar136 = auVar51._4_4_;
          auVar64._4_4_ = fVar136 * fVar90;
          auVar64._0_4_ = fVar132 * fVar90;
          fVar137 = auVar51._8_4_;
          auVar64._8_4_ = fVar137 * fVar90;
          fVar138 = auVar51._12_4_;
          auVar64._12_4_ = fVar138 * fVar90;
          fVar139 = auVar51._16_4_;
          auVar64._16_4_ = fVar139 * fVar90;
          fVar140 = auVar51._20_4_;
          auVar64._20_4_ = fVar140 * fVar90;
          fVar141 = auVar51._24_4_;
          auVar64._24_4_ = fVar141 * fVar90;
          auVar64._28_4_ = uVar1;
          fVar106 = auVar123._0_4_;
          fVar12 = auVar123._4_4_;
          auVar65._4_4_ = fVar101 * fVar12;
          auVar65._0_4_ = fVar101 * fVar106;
          fVar19 = auVar123._8_4_;
          auVar65._8_4_ = fVar101 * fVar19;
          fVar26 = auVar123._12_4_;
          auVar65._12_4_ = fVar101 * fVar26;
          fVar33 = auVar123._16_4_;
          auVar65._16_4_ = fVar101 * fVar33;
          fVar40 = auVar123._20_4_;
          auVar65._20_4_ = fVar101 * fVar40;
          fVar47 = auVar123._24_4_;
          auVar65._24_4_ = fVar101 * fVar47;
          auVar65._28_4_ = uVar2;
          auVar123 = vsubps_avx(auVar65,auVar64);
          fVar102 = *(float *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x80);
          fVar131 = auVar108._0_4_;
          fVar13 = auVar108._4_4_;
          auVar66._4_4_ = fVar101 * fVar13;
          auVar66._0_4_ = fVar101 * fVar131;
          fVar20 = auVar108._8_4_;
          auVar66._8_4_ = fVar101 * fVar20;
          fVar27 = auVar108._12_4_;
          auVar66._12_4_ = fVar101 * fVar27;
          fVar34 = auVar108._16_4_;
          auVar66._16_4_ = fVar101 * fVar34;
          fVar41 = auVar108._20_4_;
          auVar66._20_4_ = fVar101 * fVar41;
          fVar48 = auVar108._24_4_;
          auVar66._24_4_ = fVar101 * fVar48;
          auVar66._28_4_ = uVar3;
          auVar67._4_4_ = fVar136 * fVar102;
          auVar67._0_4_ = fVar132 * fVar102;
          auVar67._8_4_ = fVar137 * fVar102;
          auVar67._12_4_ = fVar138 * fVar102;
          auVar67._16_4_ = fVar139 * fVar102;
          auVar67._20_4_ = fVar140 * fVar102;
          auVar67._24_4_ = fVar141 * fVar102;
          auVar67._28_4_ = uVar58;
          auVar51 = vsubps_avx(auVar67,auVar66);
          auVar68._4_4_ = fVar102 * fVar12;
          auVar68._0_4_ = fVar102 * fVar106;
          auVar68._8_4_ = fVar102 * fVar19;
          auVar68._12_4_ = fVar102 * fVar26;
          auVar68._16_4_ = fVar102 * fVar33;
          auVar68._20_4_ = fVar102 * fVar40;
          auVar68._24_4_ = fVar102 * fVar47;
          auVar68._28_4_ = uVar3;
          auVar69._4_4_ = fVar13 * fVar90;
          auVar69._0_4_ = fVar131 * fVar90;
          auVar69._8_4_ = fVar20 * fVar90;
          auVar69._12_4_ = fVar27 * fVar90;
          auVar69._16_4_ = fVar34 * fVar90;
          auVar69._20_4_ = fVar41 * fVar90;
          auVar69._24_4_ = fVar48 * fVar90;
          auVar69._28_4_ = uVar60;
          auVar52 = vsubps_avx(auVar69,auVar68);
          fVar172 = local_1260._0_4_;
          fVar14 = local_1260._4_4_;
          fVar21 = local_1260._8_4_;
          fVar28 = local_1260._12_4_;
          fVar35 = local_1260._16_4_;
          fVar42 = local_1260._20_4_;
          fVar49 = local_1260._24_4_;
          fVar173 = local_1420._0_4_;
          fVar15 = local_1420._4_4_;
          fVar22 = local_1420._8_4_;
          fVar29 = local_1420._12_4_;
          fVar36 = local_1420._16_4_;
          fVar43 = local_1420._20_4_;
          fVar50 = local_1420._24_4_;
          auVar94._0_4_ = fVar102 * fVar173 + fVar101 * fVar172 + (float)local_1440._0_4_ * fVar90;
          auVar94._4_4_ = fVar102 * fVar15 + fVar101 * fVar14 + (float)local_1440._4_4_ * fVar90;
          auVar94._8_4_ = fVar102 * fVar22 + fVar101 * fVar21 + fStack_1438 * fVar90;
          auVar94._12_4_ = fVar102 * fVar29 + fVar101 * fVar28 + fStack_1434 * fVar90;
          auVar94._16_4_ = fVar102 * fVar36 + fVar101 * fVar35 + fStack_1430 * fVar90;
          auVar94._20_4_ = fVar102 * fVar43 + fVar101 * fVar42 + fStack_142c * fVar90;
          auVar94._24_4_ = fVar102 * fVar50 + fVar101 * fVar49 + fStack_1428 * fVar90;
          auVar94._28_4_ = fVar101 + fVar101 + fVar90;
          auVar117._8_4_ = 0x80000000;
          auVar117._0_8_ = 0x8000000080000000;
          auVar117._12_4_ = 0x80000000;
          auVar117._16_4_ = 0x80000000;
          auVar117._20_4_ = 0x80000000;
          auVar117._24_4_ = 0x80000000;
          auVar117._28_4_ = 0x80000000;
          auVar108 = vandps_avx(auVar94,auVar117);
          uVar85 = auVar108._0_4_;
          auVar124._0_4_ =
               (float)(uVar85 ^ (uint)(fVar142 * auVar123._0_4_ +
                                      fVar164 * auVar52._0_4_ + fVar156 * auVar51._0_4_));
          uVar75 = auVar108._4_4_;
          auVar124._4_4_ =
               (float)(uVar75 ^ (uint)(fVar144 * auVar123._4_4_ +
                                      fVar166 * auVar52._4_4_ + fVar158 * auVar51._4_4_));
          uVar146 = auVar108._8_4_;
          auVar124._8_4_ =
               (float)(uVar146 ^
                      (uint)(fVar145 * auVar123._8_4_ +
                            fVar167 * auVar52._8_4_ + fVar159 * auVar51._8_4_));
          uVar148 = auVar108._12_4_;
          auVar124._12_4_ =
               (float)(uVar148 ^
                      (uint)(fVar147 * auVar123._12_4_ +
                            fVar168 * auVar52._12_4_ + fVar160 * auVar51._12_4_));
          uVar150 = auVar108._16_4_;
          auVar124._16_4_ =
               (float)(uVar150 ^
                      (uint)(fVar149 * auVar123._16_4_ +
                            fVar169 * auVar52._16_4_ + fVar161 * auVar51._16_4_));
          uVar152 = auVar108._20_4_;
          auVar124._20_4_ =
               (float)(uVar152 ^
                      (uint)(fVar151 * auVar123._20_4_ +
                            fVar170 * auVar52._20_4_ + fVar162 * auVar51._20_4_));
          uVar154 = auVar108._24_4_;
          auVar124._24_4_ =
               (float)(uVar154 ^
                      (uint)(fVar153 * auVar123._24_4_ +
                            fVar171 * auVar52._24_4_ + fVar163 * auVar51._24_4_));
          uVar155 = auVar108._28_4_;
          auVar124._28_4_ =
               (float)(uVar155 ^ (uint)(auVar95._28_4_ + auVar93._28_4_ + auVar116._28_4_));
          local_1300._0_4_ =
               (float)(uVar85 ^ (uint)(auVar123._0_4_ * fVar105 +
                                      fVar104 * auVar52._0_4_ + fVar103 * auVar51._0_4_));
          local_1300._4_4_ =
               (float)(uVar75 ^ (uint)(auVar123._4_4_ * fVar11 +
                                      fVar175 * auVar52._4_4_ + fVar174 * auVar51._4_4_));
          local_1300._8_4_ =
               (float)(uVar146 ^
                      (uint)(auVar123._8_4_ * fVar18 +
                            fVar17 * auVar52._8_4_ + fVar16 * auVar51._8_4_));
          local_1300._12_4_ =
               (float)(uVar148 ^
                      (uint)(auVar123._12_4_ * fVar25 +
                            fVar24 * auVar52._12_4_ + fVar23 * auVar51._12_4_));
          local_1300._16_4_ =
               (float)(uVar150 ^
                      (uint)(auVar123._16_4_ * fVar32 +
                            fVar31 * auVar52._16_4_ + fVar30 * auVar51._16_4_));
          local_1300._20_4_ =
               (float)(uVar152 ^
                      (uint)(auVar123._20_4_ * fVar39 +
                            fVar38 * auVar52._20_4_ + fVar37 * auVar51._20_4_));
          local_1300._24_4_ =
               (float)(uVar154 ^
                      (uint)(auVar123._24_4_ * fVar46 +
                            fVar45 * auVar52._24_4_ + fVar44 * auVar51._24_4_));
          local_1300._28_4_ = (float)(uVar155 ^ (uint)(auVar52._28_4_ + auVar51._28_4_ + -0.0));
          auVar123 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar108 = vcmpps_avx(auVar124,auVar123,5);
          auVar123 = vcmpps_avx(local_1300,auVar123,5);
          auVar108 = vandps_avx(auVar108,auVar123);
          auVar118._8_4_ = 0x7fffffff;
          auVar118._0_8_ = 0x7fffffff7fffffff;
          auVar118._12_4_ = 0x7fffffff;
          auVar118._16_4_ = 0x7fffffff;
          auVar118._20_4_ = 0x7fffffff;
          auVar118._24_4_ = 0x7fffffff;
          auVar118._28_4_ = 0x7fffffff;
          local_12c0 = vandps_avx(auVar94,auVar118);
          auVar123 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar94,4);
          auVar108 = vandps_avx(auVar108,auVar123);
          auVar95._0_4_ = auVar124._0_4_ + local_1300._0_4_;
          auVar95._4_4_ = auVar124._4_4_ + local_1300._4_4_;
          auVar95._8_4_ = auVar124._8_4_ + local_1300._8_4_;
          auVar95._12_4_ = auVar124._12_4_ + local_1300._12_4_;
          auVar95._16_4_ = auVar124._16_4_ + local_1300._16_4_;
          auVar95._20_4_ = auVar124._20_4_ + local_1300._20_4_;
          auVar95._24_4_ = auVar124._24_4_ + local_1300._24_4_;
          auVar95._28_4_ = auVar124._28_4_ + local_1300._28_4_;
          auVar123 = vcmpps_avx(auVar95,local_12c0,2);
          auVar95 = auVar123 & auVar108;
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0x7f,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0xbf,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar95[0x1f] < '\0') {
            auVar108 = vandps_avx(auVar108,auVar123);
            auVar92 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
            local_12e0._0_4_ =
                 (float)(uVar85 ^ (uint)(fVar173 * fVar131 +
                                        (float)local_1440._0_4_ * fVar106 + fVar132 * fVar172));
            local_12e0._4_4_ =
                 (float)(uVar75 ^ (uint)(fVar15 * fVar13 +
                                        (float)local_1440._4_4_ * fVar12 + fVar136 * fVar14));
            local_12e0._8_4_ =
                 (float)(uVar146 ^ (uint)(fVar22 * fVar20 + fStack_1438 * fVar19 + fVar137 * fVar21)
                        );
            local_12e0._12_4_ =
                 (float)(uVar148 ^ (uint)(fVar29 * fVar27 + fStack_1434 * fVar26 + fVar138 * fVar28)
                        );
            local_12e0._16_4_ =
                 (float)(uVar150 ^ (uint)(fVar36 * fVar34 + fStack_1430 * fVar33 + fVar139 * fVar35)
                        );
            local_12e0._20_4_ =
                 (float)(uVar152 ^ (uint)(fVar43 * fVar41 + fStack_142c * fVar40 + fVar140 * fVar42)
                        );
            local_12e0._24_4_ =
                 (float)(uVar154 ^ (uint)(fVar50 * fVar48 + fStack_1428 * fVar47 + fVar141 * fVar49)
                        );
            local_12e0._28_4_ = uVar155 ^ 0x7fc00000;
            fVar90 = *(float *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x60);
            fVar101 = local_12c0._0_4_;
            fVar102 = local_12c0._4_4_;
            auVar70._4_4_ = fVar102 * fVar90;
            auVar70._0_4_ = fVar101 * fVar90;
            fVar103 = local_12c0._8_4_;
            auVar70._8_4_ = fVar103 * fVar90;
            fVar104 = local_12c0._12_4_;
            auVar70._12_4_ = fVar104 * fVar90;
            fVar105 = local_12c0._16_4_;
            auVar70._16_4_ = fVar105 * fVar90;
            fVar106 = local_12c0._20_4_;
            auVar70._20_4_ = fVar106 * fVar90;
            fVar131 = local_12c0._24_4_;
            auVar70._24_4_ = fVar131 * fVar90;
            auVar70._28_4_ = fVar90;
            auVar108 = vcmpps_avx(auVar70,local_12e0,1);
            fVar90 = *(float *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x100);
            auVar100 = ZEXT3264(CONCAT428(fVar90,CONCAT424(fVar90,CONCAT420(fVar90,CONCAT416(fVar90,
                                                  CONCAT412(fVar90,CONCAT48(fVar90,CONCAT44(fVar90,
                                                  fVar90))))))));
            auVar71._4_4_ = fVar90 * fVar102;
            auVar71._0_4_ = fVar90 * fVar101;
            auVar71._8_4_ = fVar90 * fVar103;
            auVar71._12_4_ = fVar90 * fVar104;
            auVar71._16_4_ = fVar90 * fVar105;
            auVar71._20_4_ = fVar90 * fVar106;
            auVar71._24_4_ = fVar90 * fVar131;
            auVar71._28_4_ = 0x7fffffff;
            auVar123 = vcmpps_avx(local_12e0,auVar71,2);
            auVar108 = vandps_avx(auVar108,auVar123);
            auVar107 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
            auVar92 = vpand_avx(auVar107,auVar92);
            auVar107 = vpmovzxwd_avx(auVar92);
            auVar133 = vpslld_avx(auVar107,0x1f);
            auVar91 = vpsrad_avx(auVar133,0x1f);
            auVar107 = vpunpckhwd_avx(auVar92,auVar92);
            auVar107 = vpslld_avx(auVar107,0x1f);
            auVar107 = vpsrad_avx(auVar107,0x1f);
            local_1400._16_16_ = auVar107;
            local_1400._0_16_ = auVar91;
            if ((((((((local_1400 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_1400 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_1400 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_1400 >> 0x7f,0) != '\0') ||
                  (local_1400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar107 >> 0x3f,0) != '\0') ||
                (local_1400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar107[0xf] < '\0') {
              auStack_13d8 = auVar109._8_24_;
              local_13e0 = pSVar82;
              local_1320 = auVar124;
              local_12a0 = local_1420;
              local_1280 = (float)local_1440._0_4_;
              fStack_127c = (float)local_1440._4_4_;
              fStack_1278 = fStack_1438;
              fStack_1274 = fStack_1434;
              fStack_1270 = fStack_1430;
              fStack_126c = fStack_142c;
              fStack_1268 = fStack_1428;
              uStack_1264 = uStack_1424;
              local_1240 = local_1400;
              local_1160 = local_1100;
              auVar123 = vrcpps_avx(local_12c0);
              fVar90 = auVar123._0_4_;
              auVar110._0_4_ = fVar101 * fVar90;
              fVar101 = auVar123._4_4_;
              auVar110._4_4_ = fVar102 * fVar101;
              fVar102 = auVar123._8_4_;
              auVar110._8_4_ = fVar103 * fVar102;
              fVar103 = auVar123._12_4_;
              auVar110._12_4_ = fVar104 * fVar103;
              fVar104 = auVar123._16_4_;
              auVar110._16_4_ = fVar105 * fVar104;
              fVar105 = auVar123._20_4_;
              auVar110._20_4_ = fVar106 * fVar105;
              fVar106 = auVar123._24_4_;
              auVar110._24_4_ = fVar131 * fVar106;
              auVar110._28_4_ = 0;
              auVar129._8_4_ = 0x3f800000;
              auVar129._0_8_ = 0x3f8000003f800000;
              auVar129._12_4_ = 0x3f800000;
              auVar129._16_4_ = 0x3f800000;
              auVar129._20_4_ = 0x3f800000;
              auVar129._24_4_ = 0x3f800000;
              auVar129._28_4_ = 0x3f800000;
              auVar109 = vsubps_avx(auVar129,auVar110);
              fVar90 = fVar90 + fVar90 * auVar109._0_4_;
              fVar101 = fVar101 + fVar101 * auVar109._4_4_;
              fVar102 = fVar102 + fVar102 * auVar109._8_4_;
              fVar103 = fVar103 + fVar103 * auVar109._12_4_;
              fVar104 = fVar104 + fVar104 * auVar109._16_4_;
              fVar105 = fVar105 + fVar105 * auVar109._20_4_;
              fVar106 = fVar106 + fVar106 * auVar109._24_4_;
              local_11e0._4_4_ = local_12e0._4_4_ * fVar101;
              local_11e0._0_4_ = local_12e0._0_4_ * fVar90;
              local_11e0._8_4_ = local_12e0._8_4_ * fVar102;
              local_11e0._12_4_ = local_12e0._12_4_ * fVar103;
              local_11e0._16_4_ = local_12e0._16_4_ * fVar104;
              local_11e0._20_4_ = local_12e0._20_4_ * fVar105;
              local_11e0._24_4_ = local_12e0._24_4_ * fVar106;
              local_11e0._28_4_ = local_12e0._28_4_;
              auVar130 = ZEXT3264(local_11e0);
              auVar72._4_4_ = fVar101 * auVar124._4_4_;
              auVar72._0_4_ = fVar90 * auVar124._0_4_;
              auVar72._8_4_ = fVar102 * auVar124._8_4_;
              auVar72._12_4_ = fVar103 * auVar124._12_4_;
              auVar72._16_4_ = fVar104 * auVar124._16_4_;
              auVar72._20_4_ = fVar105 * auVar124._20_4_;
              auVar72._24_4_ = fVar106 * auVar124._24_4_;
              auVar72._28_4_ = auVar109._28_4_;
              auVar108 = vminps_avx(auVar72,auVar129);
              auVar73._4_4_ = fVar101 * local_1300._4_4_;
              auVar73._0_4_ = fVar90 * local_1300._0_4_;
              auVar73._8_4_ = fVar102 * local_1300._8_4_;
              auVar73._12_4_ = fVar103 * local_1300._12_4_;
              auVar73._16_4_ = fVar104 * local_1300._16_4_;
              auVar73._20_4_ = fVar105 * local_1300._20_4_;
              auVar73._24_4_ = fVar106 * local_1300._24_4_;
              auVar73._28_4_ = auVar123._28_4_ + auVar109._28_4_;
              auVar123 = vminps_avx(auVar73,auVar129);
              auVar109 = vsubps_avx(auVar129,auVar108);
              auVar95 = vsubps_avx(auVar129,auVar123);
              local_1200 = vblendvps_avx(auVar123,auVar109,local_1100);
              local_1220 = vblendvps_avx(auVar108,auVar95,local_1100);
              local_11c0[0] = fVar173 * (float)local_1120._0_4_;
              local_11c0[1] = fVar15 * (float)local_1120._4_4_;
              local_11c0[2] = fVar22 * fStack_1118;
              local_11c0[3] = fVar29 * fStack_1114;
              fStack_11b0 = fVar36 * fStack_1110;
              fStack_11ac = fVar43 * fStack_110c;
              fStack_11a8 = fVar50 * fStack_1108;
              uStack_11a4 = local_1220._28_4_;
              local_11a0[0] = (float)local_1440._0_4_ * (float)local_1120._0_4_;
              local_11a0[1] = (float)local_1440._4_4_ * (float)local_1120._4_4_;
              local_11a0[2] = fStack_1438 * fStack_1118;
              local_11a0[3] = fStack_1434 * fStack_1114;
              fStack_1190 = fStack_1430 * fStack_1110;
              fStack_118c = fStack_142c * fStack_110c;
              fStack_1188 = fStack_1428 * fStack_1108;
              uStack_1184 = auVar108._28_4_;
              local_1180[0] = fVar172 * (float)local_1120._0_4_;
              local_1180[1] = fVar14 * (float)local_1120._4_4_;
              local_1180[2] = fVar21 * fStack_1118;
              local_1180[3] = fVar28 * fStack_1114;
              fStack_1170 = fVar35 * fStack_1110;
              fStack_116c = fVar42 * fStack_110c;
              fStack_1168 = fVar49 * fStack_1108;
              uStack_1164 = uStack_1104;
              auVar107 = vpunpckhwd_avx(auVar92,auVar92);
              auVar107 = vpslld_avx(auVar107,0x1f);
              auVar96._16_16_ = auVar107;
              auVar96._0_16_ = auVar133;
              auVar111._8_4_ = 0x7f800000;
              auVar111._0_8_ = 0x7f8000007f800000;
              auVar111._12_4_ = 0x7f800000;
              auVar111._16_4_ = 0x7f800000;
              auVar111._20_4_ = 0x7f800000;
              auVar111._24_4_ = 0x7f800000;
              auVar111._28_4_ = 0x7f800000;
              auVar108 = vblendvps_avx(auVar111,local_11e0,auVar96);
              auVar123 = vshufps_avx(auVar108,auVar108,0xb1);
              auVar123 = vminps_avx(auVar108,auVar123);
              auVar109 = vshufpd_avx(auVar123,auVar123,5);
              auVar123 = vminps_avx(auVar123,auVar109);
              auVar109 = vperm2f128_avx(auVar123,auVar123,1);
              auVar123 = vminps_avx(auVar123,auVar109);
              auVar108 = vcmpps_avx(auVar108,auVar123,0);
              auVar107 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
              auVar92 = vpand_avx(auVar107,auVar92);
              auVar107 = vpmovzxwd_avx(auVar92);
              auVar107 = vpslld_avx(auVar107,0x1f);
              auVar107 = vpsrad_avx(auVar107,0x1f);
              auVar92 = vpunpckhwd_avx(auVar92,auVar92);
              auVar92 = vpslld_avx(auVar92,0x1f);
              auVar92 = vpsrad_avx(auVar92,0x1f);
              auVar97._16_16_ = auVar92;
              auVar97._0_16_ = auVar107;
              if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar97 >> 0x7f,0) == '\0') &&
                    (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar92 >> 0x3f,0) == '\0') &&
                  (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar92[0xf]) {
                auVar97 = local_1400;
              }
              uVar75 = vmovmskps_avx(auVar97);
              uVar85 = 0;
              if (uVar75 != 0) {
                for (; (uVar75 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
                }
              }
LAB_0039bd64:
              uVar84 = (ulong)uVar85;
              uVar85 = *(uint *)(local_10e0 + uVar84 * 4);
              pGVar9 = (pSVar82->geometries).items[uVar85].ptr;
              if ((pGVar9->mask & *(uint *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1400 + uVar84 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar1 = *(undefined4 *)(local_1220 + uVar84 * 4);
                  uVar2 = *(undefined4 *)(local_1200 + uVar84 * 4);
                  *(float *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x100) = local_11c0[uVar84 - 8];
                  *(float *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x180) = local_11c0[uVar84];
                  *(float *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x1a0) = local_11a0[uVar84];
                  *(float *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x1c0) = local_1180[uVar84];
                  *(undefined4 *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x1e0) = uVar1;
                  *(undefined4 *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x200) = uVar2;
                  *(undefined4 *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x220) =
                       *(undefined4 *)((long)&local_1340 + uVar84 * 4);
                  *(uint *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x240) = uVar85;
                  *(uint *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x260) = context->user->instID[0]
                  ;
                  *(uint *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x280) =
                       context->user->instPrimID[0];
                  goto LAB_0039bb33;
                }
                local_1140 = auVar130._0_32_;
                uVar1 = *(undefined4 *)(local_1220 + uVar84 * 4);
                local_1060._4_4_ = uVar1;
                local_1060._0_4_ = uVar1;
                local_1060._8_4_ = uVar1;
                local_1060._12_4_ = uVar1;
                local_1060._16_4_ = uVar1;
                local_1060._20_4_ = uVar1;
                local_1060._24_4_ = uVar1;
                local_1060._28_4_ = uVar1;
                local_1040 = *(undefined4 *)(local_1200 + uVar84 * 4);
                auStack_ff0 = vpshufd_avx(ZEXT416(uVar85),0);
                local_1020 = *(undefined4 *)((long)&local_1340 + uVar84 * 4);
                fVar90 = local_11c0[uVar84];
                fVar101 = local_11a0[uVar84];
                local_10a0._4_4_ = fVar101;
                local_10a0._0_4_ = fVar101;
                local_10a0._8_4_ = fVar101;
                local_10a0._12_4_ = fVar101;
                local_10a0._16_4_ = fVar101;
                local_10a0._20_4_ = fVar101;
                local_10a0._24_4_ = fVar101;
                local_10a0._28_4_ = fVar101;
                fVar101 = local_1180[uVar84];
                local_1080._4_4_ = fVar101;
                local_1080._0_4_ = fVar101;
                local_1080._8_4_ = fVar101;
                local_1080._12_4_ = fVar101;
                local_1080._16_4_ = fVar101;
                local_1080._20_4_ = fVar101;
                local_1080._24_4_ = fVar101;
                local_1080._28_4_ = fVar101;
                local_10c0[0] = (RTCHitN)SUB41(fVar90,0);
                local_10c0[1] = (RTCHitN)(char)((uint)fVar90 >> 8);
                local_10c0[2] = (RTCHitN)(char)((uint)fVar90 >> 0x10);
                local_10c0[3] = (RTCHitN)(char)((uint)fVar90 >> 0x18);
                local_10c0[4] = (RTCHitN)SUB41(fVar90,0);
                local_10c0[5] = (RTCHitN)(char)((uint)fVar90 >> 8);
                local_10c0[6] = (RTCHitN)(char)((uint)fVar90 >> 0x10);
                local_10c0[7] = (RTCHitN)(char)((uint)fVar90 >> 0x18);
                local_10c0[8] = (RTCHitN)SUB41(fVar90,0);
                local_10c0[9] = (RTCHitN)(char)((uint)fVar90 >> 8);
                local_10c0[10] = (RTCHitN)(char)((uint)fVar90 >> 0x10);
                local_10c0[0xb] = (RTCHitN)(char)((uint)fVar90 >> 0x18);
                local_10c0[0xc] = (RTCHitN)SUB41(fVar90,0);
                local_10c0[0xd] = (RTCHitN)(char)((uint)fVar90 >> 8);
                local_10c0[0xe] = (RTCHitN)(char)((uint)fVar90 >> 0x10);
                local_10c0[0xf] = (RTCHitN)(char)((uint)fVar90 >> 0x18);
                local_10c0[0x10] = (RTCHitN)SUB41(fVar90,0);
                local_10c0[0x11] = (RTCHitN)(char)((uint)fVar90 >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)fVar90 >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)fVar90 >> 0x18);
                local_10c0[0x14] = (RTCHitN)SUB41(fVar90,0);
                local_10c0[0x15] = (RTCHitN)(char)((uint)fVar90 >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)fVar90 >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)fVar90 >> 0x18);
                local_10c0[0x18] = (RTCHitN)SUB41(fVar90,0);
                local_10c0[0x19] = (RTCHitN)(char)((uint)fVar90 >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar90 >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar90 >> 0x18);
                local_10c0[0x1c] = (RTCHitN)SUB41(fVar90,0);
                local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar90 >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar90 >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar90 >> 0x18);
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                uStack_101c = local_1020;
                uStack_1018 = local_1020;
                uStack_1014 = local_1020;
                uStack_1010 = local_1020;
                uStack_100c = local_1020;
                uStack_1008 = local_1020;
                uStack_1004 = local_1020;
                local_1000 = auStack_ff0;
                vcmpps_avx(local_1060,local_1060,0xf);
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                local_1440 = (undefined1  [8])k;
                *(float *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x100) = local_11c0[uVar84 - 8];
                local_14a0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar79 & 0xf) << 4));
                local_1490 = *(undefined1 (*) [16])
                              (mm_lookupmask_ps + (long)((int)uVar79 >> 4) * 0x10);
                local_1470.valid = (int *)local_14a0;
                local_1470.geometryUserPtr = pGVar9->userPtr;
                local_1470.context = context->user;
                local_1420._0_8_ = local_1470.ray;
                local_1470.hit = local_10c0;
                local_1470.N = 8;
                if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar9->intersectionFilterN)(&local_1470);
                }
                auVar92 = vpcmpeqd_avx(local_14a0,ZEXT816(0) << 0x40);
                auVar107 = vpcmpeqd_avx(local_1490,ZEXT816(0) << 0x40);
                auVar119._16_16_ = auVar107;
                auVar119._0_16_ = auVar92;
                auVar108 = _DAT_01fe9960 & ~auVar119;
                if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar108 >> 0x7f,0) == '\0') &&
                      (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar108 >> 0xbf,0) == '\0') &&
                    (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar108[0x1f]) {
                  auVar98._0_8_ = auVar92._0_8_ ^ 0xffffffffffffffff;
                  auVar98._8_4_ = auVar92._8_4_ ^ 0xffffffff;
                  auVar98._12_4_ = auVar92._12_4_ ^ 0xffffffff;
                  auVar98._16_4_ = auVar107._0_4_ ^ 0xffffffff;
                  auVar98._20_4_ = auVar107._4_4_ ^ 0xffffffff;
                  auVar98._24_4_ = auVar107._8_4_ ^ 0xffffffff;
                  auVar98._28_4_ = auVar107._12_4_ ^ 0xffffffff;
                }
                else {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var10)(&local_1470);
                  }
                  auVar91 = ZEXT816(0) << 0x40;
                  auVar92 = vpcmpeqd_avx(local_14a0,auVar91);
                  auVar107 = vpcmpeqd_avx(local_1490,auVar91);
                  auVar113._16_16_ = auVar107;
                  auVar113._0_16_ = auVar92;
                  auVar108 = vcmpps_avx(ZEXT1632(auVar91),ZEXT1632(auVar91),0xf);
                  auVar98._0_4_ = auVar92._0_4_ ^ auVar108._0_4_;
                  auVar98._4_4_ = auVar92._4_4_ ^ auVar108._4_4_;
                  auVar98._8_4_ = auVar92._8_4_ ^ auVar108._8_4_;
                  auVar98._12_4_ = auVar92._12_4_ ^ auVar108._12_4_;
                  auVar98._16_4_ = auVar107._0_4_ ^ auVar108._16_4_;
                  auVar98._20_4_ = auVar107._4_4_ ^ auVar108._20_4_;
                  auVar98._24_4_ = auVar107._8_4_ ^ auVar108._24_4_;
                  auVar98._28_4_ = auVar107._12_4_ ^ auVar108._28_4_;
                  auVar108 = auVar108 & ~auVar113;
                  if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar108 >> 0x7f,0) != '\0') ||
                        (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar108 >> 0xbf,0) != '\0') ||
                      (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar108[0x1f] < '\0') {
                    auVar108 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])local_1470.hit);
                    *(undefined1 (*) [32])(local_1470.ray + 0x180) = auVar108;
                    auVar108 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_1470.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_1470.ray + 0x1a0) = auVar108;
                    auVar108 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_1470.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_1470.ray + 0x1c0) = auVar108;
                    auVar108 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_1470.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_1470.ray + 0x1e0) = auVar108;
                    auVar108 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_1470.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_1470.ray + 0x200) = auVar108;
                    auVar108 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_1470.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_1470.ray + 0x220) = auVar108;
                    auVar108 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_1470.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_1470.ray + 0x240) = auVar108;
                    auVar108 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_1470.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_1470.ray + 0x260) = auVar108;
                    auVar108 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(local_1470.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_1470.ray + 0x280) = auVar108;
                  }
                }
                if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar98 >> 0x7f,0) == '\0') &&
                      (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar98 >> 0xbf,0) == '\0') &&
                    (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar98[0x1f]) {
                  local_14c0._0_4_ = auVar100._0_4_;
                  *(undefined4 *)(local_1420._0_8_ + (long)local_1440 * 4 + 0x100) =
                       local_14c0._0_4_;
                  local_14c0 = auVar100._0_32_;
                }
                else {
                  local_14c0 = ZEXT432(*(uint *)(local_1420._0_8_ + (long)local_1440 * 4 + 0x100));
                }
                *(undefined4 *)(local_1400 + uVar84 * 4) = 0;
                auVar100 = ZEXT3264(local_14c0);
                auVar92 = vshufps_avx(local_14c0._0_16_,local_14c0._0_16_,0);
                auVar99._16_16_ = auVar92;
                auVar99._0_16_ = auVar92;
                auVar130 = ZEXT3264(local_1140);
                auVar108 = vcmpps_avx(local_1140,auVar99,2);
                local_1400 = vandps_avx(auVar108,local_1400);
                k = (size_t)local_1440;
                pSVar82 = local_13e0;
                local_1470.ray = (RTCRayN *)local_1420._0_8_;
              }
              if ((((((((local_1400 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1400 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1400 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1400 >> 0x7f,0) == '\0') &&
                    (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_1400 >> 0xbf,0) == '\0') &&
                  (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_1400[0x1f]) goto LAB_0039bb33;
              auVar112._8_4_ = 0x7f800000;
              auVar112._0_8_ = 0x7f8000007f800000;
              auVar112._12_4_ = 0x7f800000;
              auVar112._16_4_ = 0x7f800000;
              auVar112._20_4_ = 0x7f800000;
              auVar112._24_4_ = 0x7f800000;
              auVar112._28_4_ = 0x7f800000;
              auVar108 = vblendvps_avx(auVar112,auVar130._0_32_,local_1400);
              auVar123 = vshufps_avx(auVar108,auVar108,0xb1);
              auVar123 = vminps_avx(auVar108,auVar123);
              auVar109 = vshufpd_avx(auVar123,auVar123,5);
              auVar123 = vminps_avx(auVar123,auVar109);
              auVar109 = vperm2f128_avx(auVar123,auVar123,1);
              auVar123 = vminps_avx(auVar123,auVar109);
              auVar123 = vcmpps_avx(auVar108,auVar123,0);
              auVar109 = local_1400 & auVar123;
              auVar108 = local_1400;
              if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar109 >> 0x7f,0) != '\0') ||
                    (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar109 >> 0xbf,0) != '\0') ||
                  (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar109[0x1f] < '\0') {
                auVar108 = vandps_avx(auVar123,local_1400);
              }
              uVar75 = vmovmskps_avx(auVar108);
              uVar85 = 0;
              if (uVar75 != 0) {
                for (; (uVar75 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
                }
              }
              goto LAB_0039bd64;
            }
          }
LAB_0039bb33:
          lVar86 = lVar86 + 1;
        } while (lVar86 != uVar87 - 8);
      }
      uVar1 = *(undefined4 *)((RayHitK<8> *)local_1470.ray + k * 4 + 0x100);
      auVar100 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
      auVar130 = ZEXT1664(local_1350);
      auVar135 = ZEXT1664(local_1360);
      auVar143 = ZEXT1664(local_1370);
      auVar177 = ZEXT1664(local_13b0);
      fVar90 = local_1380;
      fVar101 = fStack_137c;
      fVar102 = fStack_1378;
      fVar103 = fStack_1374;
      fVar104 = local_1390;
      fVar105 = fStack_138c;
      fVar106 = fStack_1388;
      fVar131 = fStack_1384;
      fVar172 = local_13a0;
      fVar173 = fStack_139c;
      fVar174 = fStack_1398;
      fVar175 = fStack_1394;
    }
    if (pauVar76 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }